

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O1

time_t cdash_current_time(char *strtime)

{
  size_t sVar1;
  time_t t1;
  char s [20];
  tm d1;
  time_t local_70;
  char local_68 [32];
  tm local_48;
  
  local_70 = time((time_t *)0x0);
  gmtime_r(&local_70,&local_48);
  if (strtime != (char *)0x0) {
    sVar1 = strftime(local_68,0x14,"%b %d %H:%M EDT",&local_48);
    strncpy(strtime,local_68,sVar1 + 1);
  }
  return local_70;
}

Assistant:

static time_t cdash_current_time(char *strtime) {
    time_t t1;
    struct tm d1;
    char s[20];
    size_t i;

    t1 = time(0);
    gmtime_r(&t1, &d1);

    if(strtime == NULL)
        return t1;

    i = strftime(s, 20, "%b %d %H:%M EDT", &d1);

    strncpy(strtime, s, i+1);

    return t1;
}